

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O3

bool __thiscall wallet::WalletBatch::WriteTx(WalletBatch *this,CWalletTx *wtx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  bool bVar3;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_transaction_identifier<false>_>
  local_70;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  peVar2 = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar1 = &local_70.first.field_2;
  local_70.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,DBKeys::TX_abi_cxx11_,DAT_006b92b0 + DBKeys::TX_abi_cxx11_);
  local_70.second.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  local_70.second.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  local_70.second.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  local_70.second.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  bVar3 = WriteIC<std::pair<std::__cxx11::string,transaction_identifier<false>>,wallet::CWalletTx>
                    (this,&local_70,wtx,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.first._M_dataplus._M_p,local_70.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteTx(const CWalletTx& wtx)
{
    return WriteIC(std::make_pair(DBKeys::TX, wtx.GetHash()), wtx);
}